

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  second_type pFVar1;
  ulong uVar2;
  bool bVar3;
  CppType CVar4;
  uint uVar5;
  int iVar6;
  second_type *ppFVar7;
  Message *message_00;
  undefined4 extraout_var_00;
  ulong uVar8;
  ulong uVar9;
  TextGenerator *generator_00;
  char *text;
  FieldDescriptor *field_local;
  TextGenerator *local_98;
  ulong local_90;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  string local_50;
  undefined4 extraout_var;
  
  field_local = field;
  if ((((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x4c) == 3)) &&
      (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_STRING)) &&
     (CVar4 = FieldDescriptor::cpp_type(field), CVar4 != CPPTYPE_MESSAGE)) {
    PrintShortRepeatedField(this,message,reflection,field,generator);
    return;
  }
  if (*(int *)(field + 0x4c) == 3) {
    uVar5 = (*reflection->_vptr_Reflection[6])(reflection,message,field);
  }
  else {
    uVar5 = (*reflection->_vptr_Reflection[5])(reflection,message,field);
    uVar5 = uVar5 & 0xff;
  }
  map_entries.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_entries.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  map_entries.
  super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = FieldDescriptor::is_map(field);
  if (bVar3) {
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)&local_50,message,uVar5,reflection,field_local);
    std::
    vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>::
    _M_move_assign(&map_entries,&local_50);
    std::
    _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ::~_Vector_base((_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                     *)&local_50);
  }
  uVar9 = 0;
  uVar8 = 0;
  generator_00 = generator;
  local_98 = generator;
  if (0 < (int)uVar5) {
    uVar8 = (ulong)uVar5;
  }
  while (uVar8 != uVar9) {
    uVar2 = 0xffffffffffffffff;
    if (*(int *)(field_local + 0x4c) == 3) {
      uVar2 = uVar9;
    }
    local_90 = uVar9;
    PrintFieldName(this,message,reflection,field_local,generator_00);
    CVar4 = FieldDescriptor::cpp_type(field_local);
    if (CVar4 == CPPTYPE_MESSAGE) {
      local_50._M_dataplus._M_p = (pointer)(this->default_field_value_printer_).ptr_;
      ppFVar7 = FindWithDefault<std::map<google::protobuf::FieldDescriptor_const*,google::protobuf::TextFormat::FieldValuePrinter_const*,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::TextFormat::FieldValuePrinter_const*>>>>
                          (&this->custom_printers_,&field_local,(second_type *)&local_50);
      pFVar1 = *ppFVar7;
      if (*(int *)(field_local + 0x4c) == 3) {
        if (bVar3) {
          message_00 = map_entries.
                       super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_90];
        }
        else {
          iVar6 = (*reflection->_vptr_Reflection[0x34])(reflection,message,field_local,local_90);
          message_00 = (Message *)CONCAT44(extraout_var_00,iVar6);
        }
      }
      else {
        iVar6 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field_local,0);
        message_00 = (Message *)CONCAT44(extraout_var,iVar6);
      }
      (*pFVar1->_vptr_FieldValuePrinter[0xd])
                (&local_50,pFVar1,message_00,uVar2 & 0xffffffff,(ulong)uVar5,
                 (ulong)this->single_line_mode_);
      TextGenerator::Print(generator,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      TextGenerator::Indent(generator);
      Print(this,message_00,local_98);
      TextGenerator::Outdent(local_98);
      (*pFVar1->_vptr_FieldValuePrinter[0xe])
                (&local_50,pFVar1,message_00,uVar2 & 0xffffffff,(ulong)uVar5,
                 (ulong)this->single_line_mode_);
      TextGenerator::Print(local_98,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      generator_00 = local_98;
    }
    else {
      TextGenerator::Print(generator_00,": ");
      PrintFieldValue(this,message,reflection,field_local,(int)uVar2,generator_00);
      text = "\n";
      if (this->single_line_mode_ != false) {
        text = " ";
      }
      TextGenerator::Print(generator_00,text);
    }
    uVar9 = local_90 + 1;
  }
  std::
  _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~_Vector_base(&map_entries.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 );
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator& generator) const {
  if (use_short_repeated_primitives_ &&
      field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field)) {
    count = 1;
  }

  std::vector<const Message*> map_entries;
  const bool is_map = field->is_map();
  if (is_map) {
    map_entries = DynamicMapSorter::Sort(message, count, reflection, field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FieldValuePrinter* printer = FindWithDefault(
          custom_printers_, field, default_field_value_printer_.get());
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *map_entries[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      generator.Print(
          printer->PrintMessageStart(
              sub_message, field_index, count, single_line_mode_));
      generator.Indent();
      Print(sub_message, generator);
      generator.Outdent();
      generator.Print(
          printer->PrintMessageEnd(
              sub_message, field_index, count, single_line_mode_));
    } else {
      generator.Print(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator.Print(" ");
      } else {
        generator.Print("\n");
      }
    }
  }
}